

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O1

int key_type_s(BinarySource *src)

{
  _Bool _Var1;
  int iVar2;
  long lVar3;
  long lVar4;
  ptrlen realsig;
  ptrlen realsig_00;
  ptrlen realsig_01;
  ptrlen realsig_02;
  ptrlen realsig_03;
  ptrlen pVar5;
  
  BinarySource_REWIND_TO__(src->binarysource_,0);
  pVar5.len = 0x21;
  pVar5.ptr = "SSH PRIVATE KEY FILE FORMAT 1.1\n";
  _Var1 = expect_signature(src,pVar5);
  iVar2 = 2;
  if (!_Var1) {
    BinarySource_REWIND_TO__(src->binarysource_,0);
    realsig.len = 0x1a;
    realsig.ptr = "---- BEGIN SSH2 PUBLIC KEY";
    _Var1 = expect_signature(src,realsig);
    iVar2 = 9;
    if (!_Var1) {
      BinarySource_REWIND_TO__(src->binarysource_,0);
      realsig_00.len = 0x14;
      realsig_00.ptr = "PuTTY-User-Key-File-";
      _Var1 = expect_signature(src,realsig_00);
      iVar2 = 3;
      if (!_Var1) {
        BinarySource_REWIND_TO__(src->binarysource_,0);
        realsig_01.len = 0x1e;
        realsig_01.ptr = "-----BEGIN OPENSSH PRIVATE KEY";
        _Var1 = expect_signature(src,realsig_01);
        iVar2 = 6;
        if (!_Var1) {
          BinarySource_REWIND_TO__(src->binarysource_,0);
          realsig_02.len = 0xb;
          realsig_02.ptr = "-----BEGIN ";
          _Var1 = expect_signature(src,realsig_02);
          iVar2 = 5;
          if (!_Var1) {
            BinarySource_REWIND_TO__(src->binarysource_,0);
            realsig_03.len = 0x20;
            realsig_03.ptr = "---- BEGIN SSH2 ENCRYPTED PRIVAT";
            _Var1 = expect_signature(src,realsig_03);
            iVar2 = 7;
            if (!_Var1) {
              BinarySource_REWIND_TO__(src->binarysource_,0);
              pVar5 = BinarySource_get_chars(src->binarysource_,"0123456789");
              if (pVar5.len != 0) {
                pVar5 = BinarySource_get_chars(src->binarysource_," ");
                if (pVar5.len == 1) {
                  pVar5 = BinarySource_get_chars(src->binarysource_,"0123456789");
                  if (pVar5.len != 0) {
                    pVar5 = BinarySource_get_chars(src->binarysource_," ");
                    if (pVar5.len == 1) {
                      pVar5 = BinarySource_get_chars(src->binarysource_,"0123456789");
                      if (pVar5.len != 0) {
                        pVar5 = BinarySource_get_nonchars(src->binarysource_," \n");
                        if (pVar5.len == 0) {
                          iVar2 = 8;
                          goto LAB_0012a4ec;
                        }
                      }
                    }
                  }
                }
              }
              BinarySource_REWIND_TO__(src->binarysource_,0);
              pVar5 = BinarySource_get_nonchars(src->binarysource_," \n");
              lVar4 = 0;
              do {
                lVar3 = *(long *)((long)all_keyalgs + lVar4);
                _Var1 = ptrlen_eq_string(pVar5,*(char **)(lVar3 + 0xa8));
                if (_Var1) goto LAB_0012a4a2;
                lVar4 = lVar4 + 8;
              } while (lVar4 != 0x88);
              lVar3 = 0;
LAB_0012a4a2:
              if (lVar3 != 0) {
                pVar5 = BinarySource_get_chars(src->binarysource_," ");
                if (pVar5.len == 1) {
                  pVar5 = BinarySource_get_chars
                                    (src->binarysource_,
                                     "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz+/="
                                    );
                  if (pVar5.len != 0) {
                    pVar5 = BinarySource_get_nonchars(src->binarysource_," \n");
                    if (pVar5.len == 0) {
                      iVar2 = 10;
                      goto LAB_0012a4ec;
                    }
                  }
                }
              }
              iVar2 = 1;
            }
          }
        }
      }
    }
  }
LAB_0012a4ec:
  BinarySource_REWIND_TO__(src->binarysource_,0);
  return iVar2;
}

Assistant:

int key_type_s(BinarySource *src)
{
    int toret = key_type_s_internal(src);
    BinarySource_REWIND(src);
    return toret;
}